

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<short>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  undefined4 uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  SelectionVector *pSVar4;
  short sVar5;
  short sVar6;
  undefined2 uVar7;
  ulong uVar8;
  idx_t row_idx;
  short sVar9;
  data_ptr_t pdVar10;
  bool bVar11;
  
  pdVar2 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar10 = target + target_offset * 2;
    pSVar4 = adata->sel;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      psVar3 = pSVar4->sel_vector;
      uVar8 = offset;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[offset];
      }
      sVar5 = *(short *)(pdVar2 + uVar8 * 2);
      sVar9 = (short)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
      if (sVar5 <= sVar9) {
        sVar9 = sVar5;
      }
      uVar1 = *(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
      *(short *)((long)&(stats->statistics).stats_union + 8) = sVar9;
      sVar9 = (short)uVar1;
      if (sVar9 <= sVar5) {
        sVar9 = sVar5;
      }
      *(short *)((long)&(stats->statistics).stats_union + 0x18) = sVar9;
      *(undefined2 *)pdVar10 = *(undefined2 *)(pdVar2 + uVar8 * 2);
      pdVar10 = pdVar10 + 2;
      offset = offset + 1;
    }
  }
  else {
    pdVar10 = target + target_offset * 2;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      psVar3 = adata->sel->sel_vector;
      row_idx = offset;
      if (psVar3 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar3[offset];
      }
      bVar11 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      uVar7 = 0x8000;
      if (bVar11) {
        sVar5 = *(short *)(pdVar2 + row_idx * 2);
        sVar9 = (short)*(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
        sVar6 = (short)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
        if (sVar5 <= sVar6) {
          sVar6 = sVar5;
        }
        *(short *)((long)&(stats->statistics).stats_union + 8) = sVar6;
        if (sVar5 < sVar9) {
          sVar5 = sVar9;
        }
        *(short *)((long)&(stats->statistics).stats_union + 0x18) = sVar5;
        uVar7 = *(undefined2 *)(pdVar2 + row_idx * 2);
      }
      *(undefined2 *)pdVar10 = uVar7;
      pdVar10 = pdVar10 + 2;
      offset = offset + 1;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}